

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O1

void __thiscall ColorTracker::~ColorTracker(ColorTracker *this)

{
  char cVar1;
  long *plVar2;
  
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 != '\0') {
    cv::VideoCapture::release();
    cVar1 = cv::VideoCapture::isOpened();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"succeeded to release camera: ",0x1d);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->cameraId);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"failed to release camera: ",0x1a);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->cameraId);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    }
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  cv::VideoCapture::~VideoCapture(&this->cap);
  return;
}

Assistant:

ColorTracker::~ColorTracker() noexcept{
    if (!this->cap.isOpened()){
        return;
    }
    this->cap.release();
	if (!this->cap.isOpened()) {
		cout << "succeeded to release camera: " << this->cameraId << endl;
	} else {
		cout << "failed to release camera: " << this->cameraId << endl;
	}
}